

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.cc
# Opt level: O0

void __thiscall yyFlexLexer::yy_push_state(yyFlexLexer *this,int _new_state)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  yy_size_t size;
  yy_size_t new_size;
  int _new_state_local;
  yyFlexLexer *this_local;
  
  if (this->yy_start_stack_depth <= *(int *)&(this->super_FlexLexer).field_0x1c) {
    this->yy_start_stack_depth = this->yy_start_stack_depth + 0x19;
    size = (long)this->yy_start_stack_depth << 2;
    if (this->yy_start_stack == (int *)0x0) {
      piVar3 = (int *)yyalloc(size);
      this->yy_start_stack = piVar3;
    }
    else {
      piVar3 = (int *)yyrealloc(this->yy_start_stack,size);
      this->yy_start_stack = piVar3;
    }
    if (this->yy_start_stack == (int *)0x0) {
      (*(this->super_FlexLexer)._vptr_FlexLexer[0xe])
                (this,"out of memory expanding start-condition stack");
    }
  }
  iVar1 = this->yy_start;
  piVar3 = this->yy_start_stack;
  iVar2 = *(int *)&(this->super_FlexLexer).field_0x1c;
  *(int *)&(this->super_FlexLexer).field_0x1c = iVar2 + 1;
  piVar3[iVar2] = (iVar1 + -1) / 2;
  this->yy_start = _new_state * 2 + 1;
  return;
}

Assistant:

void yyFlexLexer::yy_push_state( int _new_state )
{
    	if ( (yy_start_stack_ptr) >= (yy_start_stack_depth) )
		{
		yy_size_t new_size;

		(yy_start_stack_depth) += YY_START_STACK_INCR;
		new_size = (yy_size_t) (yy_start_stack_depth) * sizeof( int );

		if ( ! (yy_start_stack) )
			(yy_start_stack) = (int *) yyalloc( new_size  );

		else
			(yy_start_stack) = (int *) yyrealloc(
					(void *) (yy_start_stack), new_size  );

		if ( ! (yy_start_stack) )
			YY_FATAL_ERROR( "out of memory expanding start-condition stack" );
		}

	(yy_start_stack)[(yy_start_stack_ptr)++] = YY_START;

	BEGIN(_new_state);
}